

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::half> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<tinyusdz::value::half>
          (optional<tinyusdz::value::half> *__return_storage_ptr__,PrimVar *this)

{
  undefined8 in_RAX;
  optional<tinyusdz::value::half> local_14;
  
  local_14 = SUB84((ulong)in_RAX >> 0x20,0);
  get_value<tinyusdz::value::half>(&local_14,this);
  __return_storage_ptr__->has_value_ = local_14.has_value_;
  if (local_14.has_value_ == true) {
    __return_storage_ptr__->contained = local_14.contained;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }